

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  MemoryStream *pMVar1;
  char *pcVar2;
  char *pcVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  
  pMVar1 = is->is_;
  pcVar2 = pMVar1->end_;
  if (pMVar1->src_ != pcVar2) {
    pMVar1->src_ = pMVar1->src_ + 1;
  }
  pcVar3 = pMVar1->src_;
  if (pcVar3 == pcVar2) {
    bVar6 = false;
  }
  else {
    bVar6 = *pcVar3 == 'u';
  }
  if (bVar6) {
    if (pcVar3 != pcVar2) {
      pMVar1->src_ = pcVar3 + 1;
    }
    if (bVar6) {
      pcVar3 = pMVar1->src_;
      if (pcVar3 == pcVar2) {
        bVar6 = false;
      }
      else {
        bVar6 = *pcVar3 == 'l';
      }
      if (bVar6) {
        if (pcVar3 != pcVar2) {
          pMVar1->src_ = pcVar3 + 1;
        }
        if (bVar6) {
          pcVar3 = pMVar1->src_;
          if (pcVar3 == pcVar2) {
            bVar6 = false;
          }
          else {
            bVar6 = *pcVar3 == 'l';
          }
          if (bVar6) {
            if (pcVar3 != pcVar2) {
              pMVar1->src_ = pcVar3 + 1;
            }
            if (bVar6) {
              if ((long)(handler->stack_).stackEnd_ - (long)(handler->stack_).stackTop_ < 0x10) {
                internal::Stack<rapidjson::CrtAllocator>::
                Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
              }
              pcVar2 = (handler->stack_).stackTop_;
              (handler->stack_).stackTop_ = pcVar2 + 0x10;
              pcVar2[0] = '\0';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
              pcVar2[8] = '\0';
              pcVar2[9] = '\0';
              pcVar2[10] = '\0';
              pcVar2[0xb] = '\0';
              pcVar2[0xc] = '\0';
              pcVar2[0xd] = '\0';
              pcVar2[0xe] = '\0';
              pcVar2[0xf] = '\0';
              return;
            }
          }
        }
      }
    }
  }
  pCVar4 = pMVar1->src_;
  pCVar5 = pMVar1->begin_;
  *(undefined4 *)(this + 0x30) = 3;
  *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar5;
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }